

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O0

int __thiscall MainLoop::Run(MainLoop *this)

{
  bool bVar1;
  shared_ptr<MainLoop> local_20;
  MainLoop *local_10;
  MainLoop *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&__MainLoop__,(nullptr_t)0x0);
  if (bVar1) {
    Init();
    std::shared_ptr<MainLoop>::~shared_ptr(&local_20);
  }
  p_Begin(this);
  while (bVar1 = p_CheckRunCondition(this), bVar1) {
    p_Update(this);
    p_Render(this);
  }
  p_Teardown(this);
  return 0;
}

Assistant:

int MainLoop::Run()
{
	if (__MainLoop__ == NULL)
		MainLoop::Init();
	p_Begin();
	while (p_CheckRunCondition())
	{
		p_Update();
		p_Render();
	}
	p_Teardown();
	return 0;
}